

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpagesetupdialog_unix.cpp
# Opt level: O0

void __thiscall QPageSetupWidget::setupPrinter(QPageSetupWidget *this)

{
  long *plVar1;
  undefined4 uVar2;
  long in_RDI;
  
  (**(code **)(**(long **)(in_RDI + 0x1a0) + 0x48))(*(long **)(in_RDI + 0x1a0),in_RDI + 0x1d0);
  plVar1 = *(long **)(in_RDI + 0x1a0);
  uVar2 = QPageLayout::orientation();
  (**(code **)(*plVar1 + 0x58))(plVar1,uVar2);
  return;
}

Assistant:

void QPageSetupWidget::setupPrinter() const
{
    m_printer->setPageLayout(m_pageLayout);
    m_printer->setPageOrientation(m_pageLayout.orientation());
#if QT_CONFIG(cups)
    QCUPSSupport::PagesPerSheet pagesPerSheet = qvariant_cast<QCUPSSupport::PagesPerSheet>(m_ui.pagesPerSheetCombo->currentData()
);
    QCUPSSupport::PagesPerSheetLayout pagesPerSheetLayout = qvariant_cast<QCUPSSupport::PagesPerSheetLayout>(m_ui.pagesPerSheetLayoutCombo->currentData()
);
    QCUPSSupport::setPagesPerSheetLayout(m_printer, pagesPerSheet, pagesPerSheetLayout);
#endif
#ifdef PSD_ENABLE_PAPERSOURCE
    m_printer->setPaperSource((QPrinter::PaperSource)m_ui.paperSource->currentIndex());
#endif
}